

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O2

string * __thiscall
cppassert::DefaultFormatter::formatPredicateFailureMessage
          (string *__return_storage_ptr__,DefaultFormatter *this,char *predicate,char *value1Text,
          char *value2Text,string *value1,string *value2)

{
  AssertionMessage *pAVar1;
  char local_3a [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_30 = value2Text;
  local_28 = value1Text;
  local_20 = predicate;
  internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_38);
  pAVar1 = internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&local_38,(char (*) [31])"Assertion failure value of: ( ")
  ;
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&local_28);
  local_3a[1] = 0x20;
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,local_3a + 1);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&local_20);
  local_3a[0] = ' ';
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,local_3a);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&local_30);
  internal::AssertionMessage::operator<<(pAVar1,(char (*) [3])0x15c88b);
  pAVar1 = internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&local_38,(char (*) [4])"\n  ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&local_28);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char (*) [16])" evaluated to: ");
  internal::AssertionMessage::operator<<(pAVar1,value1);
  pAVar1 = internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&local_38,(char (*) [4])"\n  ");
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,&local_30);
  pAVar1 = internal::AssertionMessage::operator<<(pAVar1,(char (*) [16])" evaluated to: ");
  internal::AssertionMessage::operator<<(pAVar1,value2);
  internal::AssertionMessage::str_abi_cxx11_(__return_storage_ptr__,(AssertionMessage *)&local_38);
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultFormatter::formatPredicateFailureMessage(const char* predicate,
                                    const char* value1Text,
                                    const char* value2Text,
                                    const std::string &value1,
                                    const std::string &value2)
{
    AssertionMessage msg;
    msg << "Assertion failure value of: ( " << value1Text <<' '<<predicate<<' '
        << value2Text<<" )";
    msg << "\n  "<<value1Text<<" evaluated to: "<<value1;
    msg << "\n  "<<value2Text<<" evaluated to: "<<value2;
    return msg.str();
}